

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::DistributionFunc::checkArguments
          (DistributionFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  bool bVar1;
  Compilation *pCVar2;
  reference ppEVar3;
  Type *pTVar4;
  ulong idx;
  
  pCVar2 = ASTContext::getCompilation(context);
  bVar1 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,this->numArgs,
                     this->numArgs);
  if (bVar1) {
    for (idx = 0; idx < this->numArgs; idx = idx + 1) {
      ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::operator[](args,idx);
      pTVar4 = not_null<const_slang::ast::Type_*>::get(&(*ppEVar3)->type);
      bVar1 = Type::isIntegral(pTVar4);
      if (!bVar1) {
        ppEVar3 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (args,idx);
        pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*ppEVar3);
        return pTVar4;
      }
    }
    ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
              operator[](args,0);
    bVar1 = Expression::requireLValue
                      (*ppEVar3,context,(SourceLocation)0x0,(bitmask<slang::ast::AssignFlags>)0x0,
                       (Expression *)0x0,(EvalContext *)0x0);
    if (bVar1) {
      return pCVar2->intType;
    }
  }
  return pCVar2->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, numArgs, numArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < numArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        if (!args[0]->requireLValue(context))
            return comp.getErrorType();

        return comp.getIntType();
    }